

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

float ImGui::CalcItemWidth(void)

{
  ImGuiWindow *pIVar1;
  ImVec2 IVar2;
  float region_max_x;
  float w;
  ImGuiWindow *window;
  ImGuiContext *g;
  float local_20;
  float local_14;
  
  pIVar1 = GImGui->CurrentWindow;
  if (((GImGui->NextItemData).Flags & 1U) == 0) {
    local_14 = (pIVar1->DC).ItemWidth;
  }
  else {
    local_14 = (GImGui->NextItemData).Width;
  }
  if (local_14 < 0.0) {
    IVar2 = GetContentRegionMaxAbs();
    local_20 = IVar2.x;
    local_14 = ImMax<float>(1.0,(local_20 - (pIVar1->DC).CursorPos.x) + local_14);
  }
  return (float)(int)local_14;
}

Assistant:

float ImGui::CalcItemWidth()
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;
    float w;
    if (g.NextItemData.Flags & ImGuiNextItemDataFlags_HasWidth)
        w = g.NextItemData.Width;
    else
        w = window->DC.ItemWidth;
    if (w < 0.0f)
    {
        float region_max_x = GetContentRegionMaxAbs().x;
        w = ImMax(1.0f, region_max_x - window->DC.CursorPos.x + w);
    }
    w = IM_FLOOR(w);
    return w;
}